

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# avg.c
# Opt level: O0

void aom_highbd_hadamard_32x32_c(int16_t *src_diff,ptrdiff_t src_stride,tran_low_t *coeff)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int *in_RDX;
  int16_t *in_RSI;
  tran_low_t b3;
  tran_low_t b2;
  tran_low_t b1;
  tran_low_t b0;
  tran_low_t a3;
  tran_low_t a2;
  tran_low_t a1;
  tran_low_t a0;
  int16_t *src_ptr;
  int idx;
  undefined4 in_stack_ffffffffffffffe0;
  int iVar5;
  
  for (iVar5 = 0; iVar5 < 4; iVar5 = iVar5 + 1) {
    aom_highbd_hadamard_16x16_c
              (in_RSI,(ptrdiff_t)in_RDX,(tran_low_t *)CONCAT44(iVar5,in_stack_ffffffffffffffe0));
  }
  for (iVar5 = 0; iVar5 < 0x100; iVar5 = iVar5 + 1) {
    iVar1 = *in_RDX + in_RDX[0x100] >> 2;
    iVar2 = *in_RDX - in_RDX[0x100] >> 2;
    iVar3 = in_RDX[0x200] + in_RDX[0x300] >> 2;
    iVar4 = in_RDX[0x200] - in_RDX[0x300] >> 2;
    *in_RDX = iVar1 + iVar3;
    in_RDX[0x100] = iVar2 + iVar4;
    in_RDX[0x200] = iVar1 - iVar3;
    in_RDX[0x300] = iVar2 - iVar4;
    in_RDX = in_RDX + 1;
  }
  return;
}

Assistant:

void aom_highbd_hadamard_32x32_c(const int16_t *src_diff, ptrdiff_t src_stride,
                                 tran_low_t *coeff) {
  int idx;
  for (idx = 0; idx < 4; ++idx) {
    // src_diff: 13 bit, dynamic range [-4095, 4095]
    const int16_t *src_ptr =
        src_diff + (idx >> 1) * 16 * src_stride + (idx & 0x01) * 16;
    aom_highbd_hadamard_16x16_c(src_ptr, src_stride, coeff + idx * 256);
  }

  // coeff: 20 bit
  for (idx = 0; idx < 256; ++idx) {
    tran_low_t a0 = coeff[0];
    tran_low_t a1 = coeff[256];
    tran_low_t a2 = coeff[512];
    tran_low_t a3 = coeff[768];

    tran_low_t b0 = (a0 + a1) >> 2;
    tran_low_t b1 = (a0 - a1) >> 2;
    tran_low_t b2 = (a2 + a3) >> 2;
    tran_low_t b3 = (a2 - a3) >> 2;

    // new coeff dynamic range: 20 bit
    coeff[0] = b0 + b2;
    coeff[256] = b1 + b3;
    coeff[512] = b0 - b2;
    coeff[768] = b1 - b3;

    ++coeff;
  }
}